

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

void MiniScript::AllowLineBreak(Lexer *tokens)

{
  bool bVar1;
  Token local_70;
  Token local_50;
  
  while( true ) {
    Lexer::Peek(&local_70,tokens);
    if (local_70.type != EOL) {
      String::~String(&local_70.text);
      return;
    }
    bVar1 = Lexer::atEnd(tokens);
    String::~String(&local_70.text);
    if (bVar1) break;
    Lexer::Dequeue(&local_50,tokens);
    String::~String(&local_50.text);
  }
  return;
}

Assistant:

static void AllowLineBreak(Lexer tokens) {
		while (tokens.Peek().type == Token::Type::EOL && not tokens.atEnd()) tokens.Dequeue();
	}